

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::OptSrc(GlobOpt *this,Opnd *opnd,Instr **pInstr,Value **indirIndexValRef,
               IndirOpnd *parentIndirOpnd)

{
  short sVar1;
  Loop *loop;
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Instr *pIVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType_00;
  Instr **ppIVar5;
  Instr **ppIVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  ArgSlot AVar10;
  ObjectType OVar11;
  ObjectType OVar12;
  Bits BVar13;
  uint sourceContextId;
  uint functionId;
  int32 iVar14;
  ValueNumber VVar15;
  ValueNumber VVar16;
  undefined4 *puVar17;
  RegOpnd *pRVar18;
  Opnd *pOVar19;
  IntConstOpnd *this_01;
  Int64ConstOpnd *pIVar20;
  long intConst;
  FloatConstOpnd *pFVar21;
  AddrOpnd *this_02;
  ValueInfo *pVVar22;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar23;
  JITTimeProfileInfo *this_03;
  GlobOptBlockData *pGVar24;
  StackSym *pSVar25;
  IndirOpnd *pIVar26;
  PropertySym *pPVar27;
  PropertySymOpnd *pPVar28;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar29;
  LdLenInfo *pLVar30;
  Value *pVVar31;
  SymOpnd *pSVar32;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *local_1b8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_124;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_122;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_120;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_11e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_11c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_11a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_118;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_116;
  byte local_113;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_112;
  bool useAggressiveSpecialization;
  ProfiledInstr *pPStack_110;
  ValueType profiledArrayType;
  ProfiledInstr *profiledInstr;
  ValueType valueType;
  ValueInfo *pVStack_100;
  ValueInfo *landingPadValueInfo;
  Value *landingPadValue;
  Instr *local_e8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_da;
  Value *local_d8;
  Value *objectValue;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_c6;
  int local_c4;
  ValueType parameterType;
  int paramSlotNum;
  AddrOpnd *addrOpnd;
  double dStack_a8;
  int32 int32Value;
  FloatConstType floatValue;
  PropertySym *local_98;
  PropertySym *originalPropertySym;
  Value *val;
  Sym *sym;
  Instr **instr;
  IndirOpnd *parentIndirOpnd_local;
  Value **indirIndexValRef_local;
  Instr **pInstr_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  ValueType merged_1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  sym = (Sym *)pInstr;
  instr = (Instr **)parentIndirOpnd;
  parentIndirOpnd_local = (IndirOpnd *)indirIndexValRef;
  indirIndexValRef_local = (Value **)pInstr;
  pInstr_local = (Instr **)opnd;
  opnd_local = (Opnd *)this;
  if ((indirIndexValRef != (Value **)0x0) && (*indirIndexValRef != (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd07,"(!indirIndexValRef || !*indirIndexValRef)",
                       "!indirIndexValRef || !*indirIndexValRef");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar17 = 0;
  }
  ppIVar5 = pInstr_local;
  if (instr == (Instr **)0x0) {
    pOVar19 = IR::Instr::GetSrc1((Instr *)sym->_vptr_Sym);
    ppIVar6 = pInstr_local;
    if ((((Opnd *)ppIVar5 != pOVar19) &&
        (pOVar19 = IR::Instr::GetSrc2((Instr *)sym->_vptr_Sym), ppIVar5 = pInstr_local,
        (Opnd *)ppIVar6 != pOVar19)) &&
       ((pOVar19 = IR::Instr::GetDst((Instr *)sym->_vptr_Sym), (Opnd *)ppIVar5 != pOVar19 ||
        (bVar7 = IR::Opnd::IsIndirOpnd((Opnd *)pInstr_local), !bVar7)))) goto LAB_00585c73;
  }
  else {
    pRVar18 = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)instr);
    ppIVar6 = pInstr_local;
    if (((RegOpnd *)ppIVar5 != pRVar18) &&
       (pRVar18 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)instr), (RegOpnd *)ppIVar6 != pRVar18)) {
LAB_00585c73:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xd0b,
                         "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                         ,
                         "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                        );
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar17 = 0;
    }
  }
  local_98 = (PropertySym *)0x0;
  OVar8 = IR::Opnd::GetKind((Opnd *)pInstr_local);
  switch(OVar8) {
  case OpndKindIntConst:
    this_01 = IR::Opnd::AsIntConstOpnd((Opnd *)pInstr_local);
    iVar14 = IR::IntConstOpnd::AsInt32(this_01);
    originalPropertySym =
         (PropertySym *)GetIntConstantValue(this,iVar14,(Instr *)sym->_vptr_Sym,(Opnd *)0x0);
    ppIVar5 = pInstr_local;
    pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
    paVar29 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
              ValueInfo::Type(pVVar22);
    floatValue._6_2_ = *paVar29;
    IR::Opnd::SetValueType((Opnd *)ppIVar5,(ValueType)floatValue._6_2_);
    this_local = (GlobOpt *)originalPropertySym;
    break;
  case OpndKindInt64Const:
    pIVar20 = IR::Opnd::AsInt64ConstOpnd((Opnd *)pInstr_local);
    intConst = IR::EncodableOpnd<long>::GetValue(&pIVar20->super_EncodableOpnd<long>);
    originalPropertySym =
         (PropertySym *)GetIntConstantValue(this,intConst,(Instr *)sym->_vptr_Sym,(Opnd *)0x0);
    ppIVar5 = pInstr_local;
    pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
    paVar29 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
              ValueInfo::Type(pVVar22);
    floatValue._4_2_ = *paVar29;
    IR::Opnd::SetValueType((Opnd *)ppIVar5,(ValueType)floatValue._4_2_);
    this_local = (GlobOpt *)originalPropertySym;
    break;
  case OpndKindFloatConst:
    pFVar21 = IR::Opnd::AsFloatConstOpnd((Opnd *)pInstr_local);
    dStack_a8 = pFVar21->m_value;
    bVar7 = Js::JavascriptNumber::TryGetInt32Value<false>(dStack_a8,(int32 *)((long)&addrOpnd + 4));
    if (bVar7) {
      originalPropertySym =
           (PropertySym *)
           GetIntConstantValue(this,addrOpnd._4_4_,(Instr *)sym->_vptr_Sym,(Opnd *)0x0);
    }
    else {
      originalPropertySym = (PropertySym *)NewFloatConstantValue(this,dStack_a8,(Opnd *)0x0);
    }
    ppIVar5 = pInstr_local;
    pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
    paVar29 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
              ValueInfo::Type(pVVar22);
    addrOpnd._2_2_ = *paVar29;
    IR::Opnd::SetValueType((Opnd *)ppIVar5,(ValueType)addrOpnd._2_2_);
    this_local = (GlobOpt *)originalPropertySym;
    break;
  default:
    this_local = (GlobOpt *)0x0;
    break;
  case OpndKindSym:
    parameterType = ValueType::Uninitialized;
    IR::Opnd::SetValueType((Opnd *)pInstr_local,ValueType::Uninitialized);
    pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
    val = (Value *)pSVar32->m_sym;
    bVar7 = Sym::IsStackSym((Sym *)val);
    if (bVar7) {
      pSVar25 = Sym::AsStackSym((Sym *)val);
      bVar7 = StackSym::IsArgSlotSym(pSVar25);
      if (bVar7) {
        return (Value *)0x0;
      }
    }
    bVar7 = Sym::IsStackSym((Sym *)val);
    if (bVar7) {
      pSVar25 = Sym::AsStackSym((Sym *)val);
      bVar7 = StackSym::IsParamSlotSym(pSVar25);
      if (bVar7) {
        bVar7 = Func::IsLoopBody((Func *)sym->_vptr_Sym[4]);
        if ((!bVar7) && (bVar7 = Func::HasProfileInfo((Func *)sym->_vptr_Sym[4]), bVar7)) {
          pSVar25 = Sym::AsStackSym((Sym *)val);
          AVar10 = StackSym::GetParamSlotNum(pSVar25);
          local_c4 = AVar10 - 2;
          if (-1 < local_c4) {
            this_03 = Func::GetReadOnlyProfileInfo((Func *)sym->_vptr_Sym[4]);
            local_c8.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 JITTimeProfileInfo::GetParameterInfo(this_03,(ArgSlot)local_c4);
            local_c6.field_0 = local_c8.field_0;
            originalPropertySym = (PropertySym *)NewGenericValue(this,(ValueType)local_c8.field_0);
            ppIVar5 = pInstr_local;
            pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
            paVar29 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                      ValueInfo::Type(pVVar22);
            objectValue._6_2_ = *paVar29;
            IR::Opnd::SetValueType((Opnd *)ppIVar5,(ValueType)objectValue._6_2_);
            return (Value *)originalPropertySym;
          }
        }
        return (Value *)0x0;
      }
    }
    bVar7 = Sym::IsPropertySym((Sym *)val);
    if (bVar7) {
      local_98 = Sym::AsPropertySym((Sym *)val);
      pPVar27 = Sym::AsPropertySym(&local_98->super_Sym);
      if ((pPVar27->m_propertyId == 0x1cf) &&
         (pPVar27 = Sym::AsPropertySym(&local_98->super_Sym),
         (pPVar27->super_Sym).field_0x15 == '\0')) {
        pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
        bVar7 = IR::SymOpnd::IsPropertySymOpnd(pSVar32);
        if (bVar7) {
          pIVar2 = (Instr *)sym->_vptr_Sym;
          pPVar28 = IR::Opnd::AsPropertySymOpnd((Opnd *)pInstr_local);
          FinishOptPropOp(this,pIVar2,pPVar28,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
        }
        return (Value *)0x0;
      }
      pGVar24 = CurrentBlockData(this);
      local_d8 = GlobOptBlockData::FindValue(pGVar24,&local_98->m_stackSym->super_Sym);
      pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
      if (local_d8 == (Value *)0x0) {
        local_1b8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                    &ValueType::Uninitialized;
      }
      else {
        pVVar22 = ::Value::GetValueInfo(local_d8);
        local_1b8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                    ValueInfo::Type(pVVar22);
      }
      local_da.field_0 = *local_1b8;
      IR::SymOpnd::SetPropertyOwnerValueType(pSVar32,(ValueType)local_da.field_0);
      pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
      val = (Value *)CopyPropPropertySymObj(this,pSVar32,(Instr *)sym->_vptr_Sym);
      bVar7 = DoFieldCopyProp(this);
      if (!bVar7) {
        pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
        bVar7 = IR::SymOpnd::IsPropertySymOpnd(pSVar32);
        if (bVar7) {
          pIVar2 = (Instr *)sym->_vptr_Sym;
          pPVar28 = IR::Opnd::AsPropertySymOpnd((Opnd *)pInstr_local);
          FinishOptPropOp(this,pIVar2,pPVar28,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
        }
        return (Value *)0x0;
      }
      sVar1 = *(short *)(sym->_vptr_Sym + 6);
      if (((((sVar1 == 0x16) || ((ushort)(sVar1 - 0x80U) < 4)) || (sVar1 == 0x86)) ||
          (((ushort)(sVar1 - 0x8aU) < 2 || ((ushort)(sVar1 - 0x102U) < 2)))) ||
         ((sVar1 == 0x192 || (((ushort)(sVar1 - 500U) < 2 || (sVar1 == 0x1f8)))))) {
        return (Value *)0x0;
      }
      bVar7 = IR::Instr::CallsGetter((Instr *)sym->_vptr_Sym);
      if (bVar7) {
        return (Value *)0x0;
      }
      bVar7 = IsLoopPrePass(this);
      if ((bVar7) && (bVar7 = DoFieldPRE(this,this->rootLoopPrePass), bVar7)) {
        if (((*(ushort *)&this->prePassLoop->field_0x178 >> 7 & 1) == 0) &&
           (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                              (this->prePassLoop->fieldKilled,val[1].valueNumber), BVar9 == '\0')) {
          loop = this->rootLoopPrePass;
          pIVar2 = (Instr *)sym->_vptr_Sym;
          pPVar27 = Sym::AsPropertySym((Sym *)val);
          SetLoopFieldInitialValue(this,loop,pIVar2,pPVar27,local_98);
        }
        bVar7 = IsPREInstrCandidateLoad(*(OpCode *)(sym->_vptr_Sym + 6));
        if ((bVar7) &&
           (bVar7 = JsUtil::
                    BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::ContainsKey(this->prePassInstrMap,&val[1].valueNumber), !bVar7)) {
          this_00 = this->prePassInstrMap;
          pVVar31 = val + 1;
          local_e8 = IR::Instr::CopyWithoutDst((Instr *)sym->_vptr_Sym);
          JsUtil::
          BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::AddNew(this_00,&pVVar31->valueNumber,&local_e8);
        }
      }
    }
    goto LAB_00586797;
  case OpndKindReg:
    IR::Opnd::SetValueType((Opnd *)pInstr_local,ValueType::Uninitialized);
    pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)pInstr_local);
    val = (Value *)pRVar18->m_sym;
    pGVar24 = CurrentBlockData(this);
    pIVar2 = (Instr *)sym->_vptr_Sym;
    pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)pInstr_local);
    GlobOptBlockData::MarkTempLastUse(pGVar24,pIVar2,pRVar18);
    pSVar25 = Sym::AsStackSym((Sym *)val);
    bVar7 = StackSym::IsTypeSpec(pSVar25);
    if (bVar7) {
      pSVar25 = Sym::AsStackSym((Sym *)val);
      val = (Value *)StackSym::GetVarEquivSym(pSVar25,this->func);
    }
LAB_00586797:
    pGVar24 = CurrentBlockData(this);
    originalPropertySym = (PropertySym *)GlobOptBlockData::FindValue(pGVar24,(Sym *)val);
    if (originalPropertySym == (PropertySym *)0x0) {
      bVar7 = IR::Instr::TransfersSrcValue((Instr *)sym->_vptr_Sym);
      if (((bVar7) || (bVar7 = OpCodeAttr::CanCSE(*(OpCode *)(sym->_vptr_Sym + 6)), bVar7)) &&
         ((ppIVar5 = pInstr_local, pOVar19 = IR::Instr::GetSrc1((Instr *)sym->_vptr_Sym),
          ppIVar6 = pInstr_local, (Opnd *)ppIVar5 == pOVar19 ||
          (pOVar19 = IR::Instr::GetSrc2((Instr *)sym->_vptr_Sym), (Opnd *)ppIVar6 == pOVar19)))) {
        bVar7 = Sym::IsPropertySym((Sym *)val);
        if (bVar7) {
          pPVar27 = Sym::AsPropertySym((Sym *)val);
          originalPropertySym =
               (PropertySym *)
               CreateFieldSrcValue(this,pPVar27,local_98,(Opnd **)&pInstr_local,
                                   (Instr *)sym->_vptr_Sym);
        }
        else {
          profiledInstr._6_2_ = ValueType::Uninitialized.field_0;
          originalPropertySym =
               (PropertySym *)NewGenericValue(this,ValueType::Uninitialized,(Opnd *)pInstr_local);
        }
      }
    }
    else {
      pGVar24 = CurrentBlockData(this);
      bVar7 = GlobOptBlockData::IsLive(pGVar24,(Sym *)val);
      if ((!bVar7) && (bVar7 = Sym::IsPropertySym((Sym *)val), !bVar7)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xdc5,"(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()))",
                           "CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym())");
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 0;
      }
      if (sym->_vptr_Sym != (_func_int **)0x0) {
        pInstr_local = (Instr **)
                       CopyProp(this,(Opnd *)pInstr_local,(Instr *)sym->_vptr_Sym,
                                (Value *)originalPropertySym,(IndirOpnd *)instr);
      }
      if (pInstr_local == (Instr **)0x0) {
        return (Value *)0x0;
      }
      bVar7 = IsLoopPrePass(this);
      if ((((bVar7) && (bVar7 = Sym::IsStackSym((Sym *)val), bVar7)) &&
          (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                             (this->rootLoopPrePass->symsUsedBeforeDefined,val[1].valueNumber),
          BVar9 == '\0')) &&
         (((bVar7 = GlobOptBlockData::IsLive
                              (&this->rootLoopPrePass->landingPad->globOptData,(Sym *)val), bVar7 &&
           ((*(uint *)&this->field_0xf4 >> 0x19 & 1) == 0)) &&
          (pVVar31 = GlobOptBlockData::FindValue
                               (&this->rootLoopPrePass->landingPad->globOptData,(Sym *)val),
          pVVar31 != (Value *)0x0)))) {
        VVar15 = ::Value::GetValueNumber((Value *)originalPropertySym);
        VVar16 = ::Value::GetValueNumber(pVVar31);
        if (VVar15 == VVar16) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->rootLoopPrePass->symsUsedBeforeDefined,val[1].valueNumber);
          pVStack_100 = ::Value::GetValueInfo(pVVar31);
          bVar7 = ValueType::IsLikelyNumber(&pVStack_100->super_ValueType);
          if (bVar7) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->rootLoopPrePass->likelyNumberSymsUsedBeforeDefined,val[1].valueNumber);
            bVar7 = DoAggressiveIntTypeSpec(this);
            if (bVar7) {
              bVar7 = ValueType::IsLikelyInt(&pVStack_100->super_ValueType);
              if (bVar7) goto LAB_00586a4a;
            }
            else {
              bVar7 = ValueType::IsInt(&pVStack_100->super_ValueType);
              if (bVar7) {
LAB_00586a4a:
                BVSparse<Memory::JitArenaAllocator>::Set
                          (this->rootLoopPrePass->likelyIntSymsUsedBeforeDefined,val[1].valueNumber)
                ;
              }
            }
          }
        }
      }
    }
    bVar7 = IR::Opnd::IsSymOpnd((Opnd *)pInstr_local);
    if (bVar7) {
      pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
      bVar7 = IR::SymOpnd::IsPropertySymOpnd(pSVar32);
      if (bVar7) {
        TryOptimizeInstrWithFixedDataProperty(this,(Instr **)sym);
        pIVar2 = (Instr *)sym->_vptr_Sym;
        pPVar28 = IR::Opnd::AsPropertySymOpnd((Opnd *)pInstr_local);
        FinishOptPropOp(this,pIVar2,pPVar28,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
      }
    }
    if (originalPropertySym == (PropertySym *)0x0) {
      IR::Opnd::SetValueType((Opnd *)pInstr_local,ValueType::Uninitialized);
    }
    else {
      pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
      paVar29 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                ValueInfo::Type(pVVar22);
      profiledInstr._4_2_ = *paVar29;
      bVar7 = ValueType::IsLikelyArray((ValueType *)((long)&profiledInstr + 4));
      if (((bVar7) &&
          (bVar7 = ValueType::IsDefinite((ValueType *)((long)&profiledInstr + 4)), !bVar7)) &&
         ((bVar7 = ValueType::IsObject((ValueType *)((long)&profiledInstr + 4)), !bVar7 &&
          (bVar7 = IR::Instr::IsProfiledInstr((Instr *)sym->_vptr_Sym), bVar7)))) {
        pPStack_110 = IR::Instr::AsProfiledInstr((Instr *)sym->_vptr_Sym);
        ValueType::ValueType((ValueType *)&local_112.field_0);
        local_113 = 1;
        sVar1 = *(short *)(sym->_vptr_Sym + 6);
        if (sVar1 == 0x97) {
          pOVar19 = IR::Instr::GetSrc1((Instr *)sym->_vptr_Sym);
          bVar7 = IR::Opnd::IsIndirOpnd(pOVar19);
          ppIVar5 = pInstr_local;
          if (bVar7) {
            pOVar19 = IR::Instr::GetSrc1((Instr *)sym->_vptr_Sym);
            pIVar26 = IR::Opnd::AsIndirOpnd(pOVar19);
            pRVar18 = IR::IndirOpnd::GetBaseOpnd(pIVar26);
            if ((RegOpnd *)ppIVar5 == pRVar18) {
              local_116.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   Js::LdElemInfo::GetArrayType((pPStack_110->u).ldElemInfo);
              local_112.field_0 = local_116.field_0;
              bVar7 = Js::LdElemInfo::IsAggressiveSpecializationDisabled
                                ((pPStack_110->u).ldElemInfo);
              local_113 = (bVar7 ^ 0xffU) & 1;
            }
          }
        }
        else if ((sVar1 == 0x9a) || (sVar1 == 0x9c)) {
LAB_00586da2:
          pOVar19 = IR::Instr::GetDst((Instr *)sym->_vptr_Sym);
          bVar7 = IR::Opnd::IsIndirOpnd(pOVar19);
          ppIVar5 = pInstr_local;
          if (bVar7) {
            pOVar19 = IR::Instr::GetDst((Instr *)sym->_vptr_Sym);
            pIVar26 = IR::Opnd::AsIndirOpnd(pOVar19);
            pRVar18 = IR::IndirOpnd::GetBaseOpnd(pIVar26);
            if ((RegOpnd *)ppIVar5 == pRVar18) {
              local_118.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   Js::StElemInfo::GetArrayType((pPStack_110->u).stElemInfo);
              local_112.field_0 = local_118.field_0;
              bVar7 = Js::StElemInfo::IsAggressiveSpecializationDisabled
                                ((pPStack_110->u).stElemInfo);
              local_113 = (bVar7 ^ 0xffU) & 1;
            }
          }
        }
        else if (sVar1 == 0xa6) {
          pOVar19 = IR::Instr::GetSrc1((Instr *)sym->_vptr_Sym);
          bVar7 = IR::Opnd::IsRegOpnd(pOVar19);
          ppIVar5 = pInstr_local;
          if ((bVar7) &&
             (pOVar19 = IR::Instr::GetSrc1((Instr *)sym->_vptr_Sym), (Opnd *)ppIVar5 == pOVar19)) {
            pLVar30 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::LdLenInfo
                                ((anon_union_8_4_88fdcd80 *)&(pPStack_110->u).field_3);
            local_11a.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 Js::LdLenInfo::GetArrayType(pLVar30);
            local_112.field_0 = local_11a.field_0;
            pLVar30 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::LdLenInfo
                                ((anon_union_8_4_88fdcd80 *)&(pPStack_110->u).field_3);
            bVar7 = Js::LdLenInfo::IsAggressiveSpecializationDisabled(pLVar30);
            local_113 = (bVar7 ^ 0xffU) & 1;
          }
        }
        else if (sVar1 == 0xbb) {
          pOVar19 = IR::Instr::GetSrc2((Instr *)sym->_vptr_Sym);
          bVar7 = IR::Opnd::IsRegOpnd(pOVar19);
          ppIVar5 = pInstr_local;
          if ((bVar7) &&
             (pOVar19 = IR::Instr::GetSrc2((Instr *)sym->_vptr_Sym), (Opnd *)ppIVar5 == pOVar19)) {
            local_11c.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 Js::LdElemInfo::GetArrayType((pPStack_110->u).ldElemInfo);
            local_112.field_0 = local_11c.field_0;
            bVar7 = Js::LdElemInfo::IsAggressiveSpecializationDisabled((pPStack_110->u).ldElemInfo);
            local_113 = (bVar7 ^ 0xffU) & 1;
          }
        }
        else if (sVar1 == 0x22c) goto LAB_00586da2;
        bVar7 = ValueType::IsLikelyObject((ValueType *)&local_112.field_0);
        if (bVar7) {
          if ((local_113 & 1) != 0) {
            OVar11 = ValueType::GetObjectType((ValueType *)&local_112.field_0);
            OVar12 = ValueType::GetObjectType((ValueType *)((long)&profiledInstr + 4));
            if (((OVar11 == OVar12) &&
                (bVar7 = ValueType::IsLikelyNativeIntArray((ValueType *)((long)&profiledInstr + 4)),
                !bVar7)) &&
               ((bVar7 = ValueType::HasIntElements((ValueType *)&local_112.field_0), bVar7 ||
                ((bVar7 = ValueType::HasVarElements((ValueType *)((long)&profiledInstr + 4)), bVar7
                 && (bVar7 = ValueType::HasFloatElements((ValueType *)&local_112.field_0), bVar7))))
               )) {
              bVar7 = ValueType::HasNoMissingValues((ValueType *)((long)&profiledInstr + 4));
              local_11e.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetHasNoMissingValues((ValueType *)&local_112.field_0,bVar7);
              pBVar3 = this->currentBlock;
              profiledInstr._4_2_ = local_11e.field_0;
              pGVar24 = CurrentBlockData(this);
              pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)pInstr_local);
              pVVar31 = GlobOptBlockData::FindValue(pGVar24,&pRVar18->m_sym->super_Sym);
              local_120.field_0 = profiledInstr._4_2_;
              ChangeValueType(this,pBVar3,pVVar31,(ValueType)profiledInstr._4_2_,false,false);
              goto LAB_005873d9;
            }
          }
          if ((local_113 & 1) == 0) {
            OVar11 = ValueType::GetObjectType((ValueType *)&local_112.field_0);
            OVar12 = ValueType::GetObjectType((ValueType *)((long)&profiledInstr + 4));
            if ((OVar11 != OVar12) ||
               ((bVar7 = ValueType::IsLikelyNativeArray((ValueType *)((long)&profiledInstr + 4)),
                bVar7 && ((bVar7 = ValueType::HasVarElements((ValueType *)&local_112.field_0), bVar7
                          || ((bVar7 = ValueType::HasIntElements
                                                 ((ValueType *)((long)&profiledInstr + 4)), bVar7 &&
                              (bVar7 = ValueType::HasFloatElements((ValueType *)&local_112.field_0),
                              bVar7)))))))) {
              bVar7 = ValueType::IsLikelyArray((ValueType *)&local_112.field_0);
              valueType_00 = local_112;
              if (bVar7) {
                merged = ValueType::Verify((ValueType)profiledInstr._4_2_);
                local_1e.field_0 = valueType_00.field_0;
                local_20.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(valueType_00.field_0);
                local_22.field_0 = valueType_00.field_0;
                bVar7 = ValueType::operator==
                                  ((ValueType *)((long)&profiledInstr + 4),
                                   (ValueType)valueType_00.field_0);
                if (bVar7) {
                  local_a.field_0 = profiledInstr._4_2_;
                }
                else {
                  BVar13 = operator|(profiledInstr._4_2_,valueType_00.bits);
                  ValueType::ValueType((ValueType *)&local_24.field_0,BVar13);
                  bVar7 = ValueType::OneOn((ValueType *)&local_24.field_0,Object);
                  if (bVar7) {
                    local_a.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::MergeWithObject
                                   ((ValueType *)((long)&profiledInstr + 4),valueType_00.field_0);
                  }
                  else {
                    local_a.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::Verify(local_24.field_0);
                  }
                }
                local_124.field_0 = local_a.field_0;
                bVar7 = ValueType::HasNoMissingValues((ValueType *)((long)&profiledInstr + 4));
                local_122.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::SetHasNoMissingValues((ValueType *)&local_124.field_0,bVar7);
                profiledInstr._4_2_ = local_122.field_0;
              }
              else {
                merged_1 = ValueType::Verify((ValueType)profiledInstr._4_2_);
                local_3e.field_0 = valueType_00.field_0;
                local_40.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(valueType_00.field_0);
                local_42.field_0 = valueType_00.field_0;
                bVar7 = ValueType::operator==
                                  ((ValueType *)((long)&profiledInstr + 4),
                                   (ValueType)valueType_00.field_0);
                if (bVar7) {
                  local_2a.field_0 = profiledInstr._4_2_;
                }
                else {
                  BVar13 = operator|(profiledInstr._4_2_,valueType_00.bits);
                  ValueType::ValueType((ValueType *)&local_44.field_0,BVar13);
                  bVar7 = ValueType::OneOn((ValueType *)&local_44.field_0,Object);
                  if (bVar7) {
                    local_48.field_0 = valueType_00.field_0;
                    local_2a.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::MergeWithObject
                                   ((ValueType *)((long)&profiledInstr + 4),valueType_00.field_0);
                  }
                  else {
                    local_46.field_0 = local_44.field_0;
                    local_2a.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ValueType::Verify(local_44.field_0);
                  }
                }
                profiledInstr._4_2_ = local_2a.field_0;
              }
              pBVar3 = this->currentBlock;
              pGVar24 = CurrentBlockData(this);
              pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)pInstr_local);
              pVVar31 = GlobOptBlockData::FindValue(pGVar24,&pRVar18->m_sym->super_Sym);
              ChangeValueType(this,pBVar3,pVVar31,(ValueType)profiledInstr._4_2_,false,true);
            }
          }
        }
      }
LAB_005873d9:
      IR::Opnd::SetValueType((Opnd *)pInstr_local,(ValueType)profiledInstr._4_2_);
      bVar7 = IsLoopPrePass(this);
      if (((!bVar7) && (bVar7 = IR::Opnd::IsSymOpnd((Opnd *)pInstr_local), bVar7)) &&
         ((bVar7 = ValueType::IsDefinite((ValueType *)((long)&profiledInstr + 4)), bVar7 ||
          (bVar7 = ValueType::IsNotTaggedValue((ValueType *)((long)&profiledInstr + 4)), bVar7)))) {
        pSVar32 = IR::Opnd::AsSymOpnd((Opnd *)pInstr_local);
        bVar7 = Sym::IsPropertySym(pSVar32->m_sym);
        if (bVar7) {
          bVar7 = DoFieldCopyProp(this);
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar17 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xe5d,"(DoFieldCopyProp())","DoFieldCopyProp()");
            if (!bVar7) {
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar17 = 0;
          }
          CaptureNoImplicitCallUses(this,(Opnd *)pInstr_local,false,(Instr *)sym->_vptr_Sym);
        }
      }
    }
    this_local = (GlobOpt *)originalPropertySym;
    break;
  case OpndKindAddr:
    this_02 = IR::Opnd::AsAddrOpnd((Opnd *)pInstr_local);
    if (((byte)this_02->field_0x28 >> 1 & 1) == 0) {
      bVar7 = IR::AddrOpnd::IsVar(this_02);
      if ((bVar7) && (bVar7 = Js::TaggedInt::Is(this_02->m_address), bVar7)) {
        iVar14 = Js::TaggedInt::ToInt32(this_02->m_address);
        originalPropertySym =
             (PropertySym *)GetIntConstantValue(this,iVar14,(Instr *)sym->_vptr_Sym,(Opnd *)0x0);
        ppIVar5 = pInstr_local;
        pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
        paVar23 = &ValueInfo::Type(pVVar22)->field_0;
        IR::Opnd::SetValueType
                  ((Opnd *)ppIVar5,
                   (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar23->field_0);
        this_local = (GlobOpt *)originalPropertySym;
      }
      else {
        this_local = (GlobOpt *)GetVarConstantValue(this,this_02);
      }
    }
    else {
      sourceContextId = Func::GetSourceContextId((Func *)sym->_vptr_Sym[4]);
      functionId = Func::GetLocalFunctionId((Func *)sym->_vptr_Sym[4]);
      bVar7 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eafdf0,FixedMethodsPhase,sourceContextId,functionId);
      if (bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xd30,
                           "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                           ,"Fixed function address operand with fixed method calls phase disabled?"
                          );
        if (!bVar7) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar17 = 0;
      }
      originalPropertySym =
           (PropertySym *)
           NewFixedFunctionValue(this,(JavascriptFunction *)this_02->m_address,this_02);
      ppIVar5 = pInstr_local;
      pVVar22 = ::Value::GetValueInfo((Value *)originalPropertySym);
      paVar23 = &ValueInfo::Type(pVVar22)->field_0;
      IR::Opnd::SetValueType
                ((Opnd *)ppIVar5,
                 (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar23->field_0);
      this_local = (GlobOpt *)originalPropertySym;
    }
    break;
  case OpndKindIndir:
    pIVar26 = IR::Opnd::AsIndirOpnd((Opnd *)pInstr_local);
    OptimizeIndirUses(this,pIVar26,(Instr **)sym,(Value **)parentIndirOpnd_local);
    this_local = (GlobOpt *)0x0;
  }
  return (Value *)this_local;
}

Assistant:

Value*
GlobOpt::OptSrc(IR::Opnd *opnd, IR::Instr * *pInstr, Value **indirIndexValRef, IR::IndirOpnd *parentIndirOpnd)
{
    IR::Instr * &instr = *pInstr;
    Assert(!indirIndexValRef || !*indirIndexValRef);
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    Sym *sym;
    Value *val;
    PropertySym *originalPropertySym = nullptr;

    switch(opnd->GetKind())
    {
    case IR::OpndKindIntConst:
        val = this->GetIntConstantValue(opnd->AsIntConstOpnd()->AsInt32(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindInt64Const:
        val = this->GetIntConstantValue(opnd->AsInt64ConstOpnd()->GetValue(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindFloatConst:
    {
        const FloatConstType floatValue = opnd->AsFloatConstOpnd()->m_value;
        int32 int32Value;
        if(Js::JavascriptNumber::TryGetInt32Value(floatValue, &int32Value))
        {
            val = GetIntConstantValue(int32Value, instr);
        }
        else
        {
            val = NewFloatConstantValue(floatValue);
        }
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    }

    case IR::OpndKindAddr:
        {
            IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
            if (addrOpnd->m_isFunction)
            {
                AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instr->m_func), "Fixed function address operand with fixed method calls phase disabled?");
                val = NewFixedFunctionValue((Js::JavascriptFunction *)addrOpnd->m_address, addrOpnd);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            else if (addrOpnd->IsVar() && Js::TaggedInt::Is(addrOpnd->m_address))
            {
                val = this->GetIntConstantValue(Js::TaggedInt::ToInt32(addrOpnd->m_address), instr);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            val = this->GetVarConstantValue(addrOpnd);
            return val;
        }

    case IR::OpndKindSym:
    {
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsSymOpnd()->m_sym;

        // Don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsArgSlotSym())
        {
            return nullptr;
        }

        // Unless we have profile info, don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsParamSlotSym())
        {
            if (!instr->m_func->IsLoopBody() && instr->m_func->HasProfileInfo())
            {
                // Skip "this" pointer.
                int paramSlotNum = sym->AsStackSym()->GetParamSlotNum() - 2;
                if (paramSlotNum >= 0)
                {
                    const auto parameterType = instr->m_func->GetReadOnlyProfileInfo()->GetParameterInfo(static_cast<Js::ArgSlot>(paramSlotNum));
                    val = NewGenericValue(parameterType);
                    opnd->SetValueType(val->GetValueInfo()->Type());
                    return val;
                }
            }
            return nullptr;
        }

        if (!sym->IsPropertySym())
        {
            break;
        }
        originalPropertySym = sym->AsPropertySym();

        // Don't give a value to 'arguments' property sym to prevent field copy prop of 'arguments'
        if (originalPropertySym->AsPropertySym()->m_propertyId == Js::PropertyIds::arguments &&
            originalPropertySym->AsPropertySym()->m_fieldKind == PropertyKindData)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }

        Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
        opnd->AsSymOpnd()->SetPropertyOwnerValueType(
            objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

        
        sym = this->CopyPropPropertySymObj(opnd->AsSymOpnd(), instr);

        if (!DoFieldCopyProp())
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }
        switch (instr->m_opcode)
        {
            // These need the symbolic reference to the field, don't copy prop the value of the field
        case Js::OpCode::DeleteFld:
        case Js::OpCode::DeleteRootFld:
        case Js::OpCode::DeleteFldStrict:
        case Js::OpCode::DeleteRootFldStrict:
        case Js::OpCode::ScopedDeleteFld:
        case Js::OpCode::ScopedDeleteFldStrict:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::LdMethodFldPolyInlineMiss:
        case Js::OpCode::StSlotChkUndecl:
        case Js::OpCode::ScopedLdInst:
            return nullptr;
        };

        if (instr->CallsGetter())
        {
            return nullptr;
        }

        if (this->IsLoopPrePass() && this->DoFieldPRE(this->rootLoopPrePass))
        {
            if (!this->prePassLoop->allFieldsKilled && !this->prePassLoop->fieldKilled->Test(sym->m_id))
            {
                this->SetLoopFieldInitialValue(this->rootLoopPrePass, instr, sym->AsPropertySym(), originalPropertySym);
            }
            if (this->IsPREInstrCandidateLoad(instr->m_opcode))
            {
                // Foreach property sym, remember the first instruction that loads it.
                // Can this be done in one call?
                if (!this->prePassInstrMap->ContainsKey(sym->m_id))
                {
                    this->prePassInstrMap->AddNew(sym->m_id, instr->CopyWithoutDst());
                }
            }
        }
        break; 
    }
    case IR::OpndKindReg:
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsRegOpnd()->m_sym;
        CurrentBlockData()->MarkTempLastUse(instr, opnd->AsRegOpnd());
        if (sym->AsStackSym()->IsTypeSpec())
        {
            sym = sym->AsStackSym()->GetVarEquivSym(this->func);
        }
        break;

    case IR::OpndKindIndir:
        this->OptimizeIndirUses(opnd->AsIndirOpnd(), &instr, indirIndexValRef);
        return nullptr;

    default:
        return nullptr;
    }

    val = CurrentBlockData()->FindValue(sym);

    if (val)
    {
        Assert(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()));
        if (instr)
        {
            opnd = this->CopyProp(opnd, instr, val, parentIndirOpnd);
        }

        // Check if we freed the operand.
        if (opnd == nullptr)
        {
            return nullptr;
        }

        // In a loop prepass, determine stack syms that are used before they are defined in the root loop for which the prepass
        // is being done. This information is used to do type specialization conversions in the landing pad where appropriate.
        if(IsLoopPrePass() &&
            sym->IsStackSym() &&
            !rootLoopPrePass->symsUsedBeforeDefined->Test(sym->m_id) &&
            rootLoopPrePass->landingPad->globOptData.IsLive(sym) && !isAsmJSFunc) // no typespec in asmjs and hence skipping this
        {
            Value *const landingPadValue = rootLoopPrePass->landingPad->globOptData.FindValue(sym);
            if(landingPadValue && val->GetValueNumber() == landingPadValue->GetValueNumber())
            {
                rootLoopPrePass->symsUsedBeforeDefined->Set(sym->m_id);
                ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
                if(landingPadValueInfo->IsLikelyNumber())
                {
                    rootLoopPrePass->likelyNumberSymsUsedBeforeDefined->Set(sym->m_id);
                    if(DoAggressiveIntTypeSpec() ? landingPadValueInfo->IsLikelyInt() : landingPadValueInfo->IsInt())
                    {
                        // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
                        // specialization is enabled.
                        rootLoopPrePass->likelyIntSymsUsedBeforeDefined->Set(sym->m_id);
                    }
                }
            }
        }
    }
    else if ((instr->TransfersSrcValue() || OpCodeAttr::CanCSE(instr->m_opcode)) && (opnd == instr->GetSrc1() || opnd == instr->GetSrc2()))
    {
        if (sym->IsPropertySym())
        {
            val = this->CreateFieldSrcValue(sym->AsPropertySym(), originalPropertySym, &opnd, instr);
        }
        else
        {
            val = this->NewGenericValue(ValueType::Uninitialized, opnd);
        }
    }

    if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        TryOptimizeInstrWithFixedDataProperty(&instr);
        this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
    }

    if (val)
    {
        ValueType valueType(val->GetValueInfo()->Type());

        // This block uses per-instruction profile information on array types to optimize using the best available profile
        // information and to prevent infinite bailouts by ensuring array type information is updated on bailouts.
        if (valueType.IsLikelyArray() && !valueType.IsDefinite() && !valueType.IsObject() && instr->IsProfiledInstr())
        {
            // See if we have profile data for the array type
            IR::ProfiledInstr *const profiledInstr = instr->AsProfiledInstr();
            ValueType profiledArrayType;

            bool useAggressiveSpecialization = true;
            switch(instr->m_opcode)
            {
                case Js::OpCode::LdElemI_A:
                    if(instr->GetSrc1()->IsIndirOpnd() && opnd == instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::StElemI_A:
                case Js::OpCode::StElemI_A_Strict:
                case Js::OpCode::StElemC:
                    if(instr->GetDst()->IsIndirOpnd() && opnd == instr->GetDst()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.stElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.stElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::LdLen_A:
                    if(instr->GetSrc1()->IsRegOpnd() && opnd == instr->GetSrc1())
                    {
                        profiledArrayType = profiledInstr->u.LdLenInfo().GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.LdLenInfo().IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::IsIn:
                    if (instr->GetSrc2()->IsRegOpnd() && opnd == instr->GetSrc2())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;
            }

            if (profiledArrayType.IsLikelyObject())
            {
                // Ideally we want to use the most specialized type seen by this path, but when that causes bailouts use the least specialized type instead.
                if (useAggressiveSpecialization && 
                    profiledArrayType.GetObjectType() == valueType.GetObjectType() &&
                    !valueType.IsLikelyNativeIntArray() &&
                    (
                        profiledArrayType.HasIntElements() || (valueType.HasVarElements() && profiledArrayType.HasFloatElements())
                    ))
                {
                    // use the more specialized type profiled by the instruction.
                    valueType = profiledArrayType.SetHasNoMissingValues(valueType.HasNoMissingValues());
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false);
                }
                else if (!useAggressiveSpecialization && 
                    (profiledArrayType.GetObjectType() != valueType.GetObjectType() ||
                        (
                            valueType.IsLikelyNativeArray() &&
                            (
                                profiledArrayType.HasVarElements() || (valueType.HasIntElements() && profiledArrayType.HasFloatElements())
                            )
                        )
                    ))
                {
                    // Merge array type we pulled from profile with type propagated by dataflow.
                    if (profiledArrayType.IsLikelyArray())
                    {
                        valueType = valueType.Merge(profiledArrayType).SetHasNoMissingValues(valueType.HasNoMissingValues());
                    }
                    else
                    {
                        valueType = valueType.Merge(profiledArrayType);
                    }
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false, true);
                }
            }
        }

        opnd->SetValueType(valueType);

        if(!IsLoopPrePass() && opnd->IsSymOpnd() && (valueType.IsDefinite() || valueType.IsNotTaggedValue()))
        {
            if (opnd->AsSymOpnd()->m_sym->IsPropertySym())
            {
                // A property sym can only be guaranteed to have a definite value type when implicit calls are disabled from the
                // point where the sym was defined with the definite value type. Insert an instruction to indicate to the
                // dead-store pass that implicit calls need to be kept disabled until after this instruction.
                Assert(DoFieldCopyProp());
                CaptureNoImplicitCallUses(opnd, false, instr);
            }
        }
    }
    else
    {
        opnd->SetValueType(ValueType::Uninitialized);
    }

    return val;
}